

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-builder.h
# Opt level: O3

Binary * __thiscall
wasm::Builder::makeBinary(Builder *this,BinaryOp op,Expression *left,Expression *right)

{
  Binary *this_00;
  
  this_00 = (Binary *)MixedArena::allocSpace(&this->wasm->allocator,0x28,8);
  (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression._id = BinaryId;
  (this_00->super_SpecificExpression<(wasm::Expression::Id)16>).super_Expression.type.id = 0;
  this_00->op = op;
  this_00->left = left;
  this_00->right = right;
  Binary::finalize(this_00);
  return this_00;
}

Assistant:

Binary* makeBinary(BinaryOp op, Expression* left, Expression* right) {
    auto* ret = wasm.allocator.alloc<Binary>();
    ret->op = op;
    ret->left = left;
    ret->right = right;
    ret->finalize();
    return ret;
  }